

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::traversedashwordlistdashfindnext(Forth *this)

{
  pointer pDVar1;
  uint uVar2;
  long lVar3;
  uint Value;
  ulong uVar4;
  
  requireDStackDepth(this,1,"TRAVERSE-WORDLIST-FINDNEXT");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack);
  Value = 0;
  if (uVar2 != 0) {
    uVar4 = (ulong)uVar2;
    pDVar1 = (this->definitions).
             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Value = 0;
    if (uVar4 < (ulong)(((long)(this->definitions).
                               super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x50)) {
      for (lVar3 = uVar4 * 0x50; lVar3 != 0x50; lVar3 = lVar3 + -0x50) {
        if (((*(uint *)((long)pDVar1 + lVar3 + -0x38) & *(uint *)((long)pDVar1 + lVar3 + -8)) == 0)
           && (*(int *)((long)pDVar1 + lVar3 + -0xc) == pDVar1[uVar4].searchOrder)) {
          Value = *(uint *)((long)pDVar1 + lVar3 + -0x10);
          break;
        }
      }
    }
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,Value);
  return;
}

Assistant:

void traversedashwordlistdashfindnext(){
					REQUIRE_DSTACK_DEPTH(1, "TRAVERSE-WORDLIST-FINDNEXT");
					auto nt = dStack.getTop(); 
					if(nt>0 && nt<definitions.size()){
						auto wid=definitions[nt].searchOrder;
						for (auto i = nt-1; i > 0 ; --i) {
							auto& defnLook = definitions[i];
							//if (!defn.isFindable())
							if (defnLook.isHidden())
								continue;
							if(defnLook.searchOrder==wid){
								dStack.setTop(defnLook.numberInVector);
								return;
							}
						}
					}
					dStack.setTop(0);	
		}